

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

Value __thiscall luna::Table::GetValue(Table *this,Value *key)

{
  bool bVar1;
  ulong uVar2;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *puVar3;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *puVar4;
  type this_00;
  anon_union_8_9_8deb4486_for_Value_0 *paVar5;
  pointer ppVar6;
  double *in_RSI;
  Table *in_RDI;
  Value VVar7;
  iterator it;
  size_t index;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_38;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_30;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *local_28;
  double *local_20;
  anon_union_8_9_8deb4486_for_Value_0 local_10;
  undefined4 local_8;
  
  if ((((*(int *)(in_RSI + 1) == 2) &&
       (local_20 = in_RSI, bVar1 = anon_unknown.dwarf_9b466::IsInt(1.01625993109717e-317), bVar1))
      && (uVar2 = (ulong)*local_20,
         puVar3 = (unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                   *)(uVar2 | (long)(*local_20 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f),
         local_28 = puVar3,
         puVar3 != (unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                    *)0x0)) &&
     (puVar4 = (unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                *)ArraySize(in_RDI), in_stack_ffffffffffffffb8 = puVar3, puVar3 <= puVar4)) {
    this_00 = std::
              unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ::operator*((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                           *)in_RDI);
    paVar5 = &std::vector<luna::Value,_std::allocator<luna::Value>_>::operator[]
                        (this_00,(size_type)((long)&local_28[-1]._M_h._M_single_bucket + 7))->
              field_0;
    local_10 = (anon_union_8_9_8deb4486_for_Value_0)paVar5->obj_;
    local_8 = SUB84(paVar5[1],0);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                        *)0x1f638e);
    if (bVar1) {
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x1f63a2);
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
           ::find(in_stack_ffffffffffffffb8,(key_type *)0x1f63af);
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x1f63c2);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
           ::end(in_stack_ffffffffffffffb8);
      bVar1 = std::__detail::operator!=(&local_30,&local_38);
      if (bVar1) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>::operator->
                           ((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x1f63ee);
        local_10 = (anon_union_8_9_8deb4486_for_Value_0)(ppVar6->second).field_0.obj_;
        local_8 = (undefined4)*(undefined8 *)&(ppVar6->second).type_;
        goto LAB_001f640e;
      }
    }
    Value::Value((Value *)&local_10);
  }
LAB_001f640e:
  VVar7.type_ = local_8;
  VVar7.field_0.obj_ = local_10.obj_;
  VVar7._12_4_ = 0;
  return VVar7;
}

Assistant:

Value Table::GetValue(const Value &key) const
    {
        // Get from array first
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            std::size_t index = static_cast<std::size_t>(key.num_);
            if (index >= 1 && index <= ArraySize())
                return (*array_)[index - 1];
        }

        // Get from hash table
        if (hash_)
        {
            auto it = hash_->find(key);
            if (it != hash_->end())
                return it->second;
        }

        // key not exist
        return Value();
    }